

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# des.c
# Opt level: O3

LR des_round(LR in,des_keysched *sched,size_t round)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  long lVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  uint uVar27;
  uint uVar28;
  uint uVar29;
  uint uVar30;
  uint uVar31;
  uint uVar32;
  uint uVar33;
  uint uVar34;
  uint uVar35;
  
  uVar2 = in.R;
  uVar1 = sched->k7531[round] ^ uVar2;
  uVar4 = (uVar2 << 4 | uVar2 >> 0x1c) ^ sched->k6420[round];
  uVar7 = uVar1 >> 8 & 0xfc00fc | 0xff00ff00;
  uVar2 = uVar1 & 0xfc00fc | 0xff00ff00;
  uVar3 = uVar4 >> 8 & 0xfc00fc | 0xff00ff00;
  uVar5 = uVar4 & 0xfc00fc | 0xff00ff00;
  uVar8 = uVar5 + 0x80008;
  uVar9 = uVar5 + 0x100010;
  uVar10 = uVar5 + 0x180018;
  uVar15 = uVar7 + 0x80008;
  uVar16 = uVar7 + 0x100010;
  uVar17 = uVar7 + 0x180018;
  uVar22 = uVar2 + 0x80008;
  uVar23 = uVar2 + 0x100010;
  uVar24 = uVar2 + 0x180018;
  uVar29 = uVar3 + 0x80008;
  uVar30 = uVar3 + 0x100010;
  uVar31 = uVar3 + 0x180018;
  uVar25 = 0;
  uVar26 = 0;
  uVar27 = 0;
  uVar28 = 0;
  lVar6 = 0;
  uVar32 = 0;
  uVar33 = 0;
  uVar34 = 0;
  uVar35 = 0;
  uVar18 = 0;
  uVar19 = 0;
  uVar20 = 0;
  uVar21 = 0;
  uVar11 = 0;
  uVar12 = 0;
  uVar13 = 0;
  uVar14 = 0;
  do {
    uVar11 = uVar11 ^ *(uint *)((long)&des_S_tbl + lVar6) & uVar5;
    uVar12 = uVar12 ^ *(uint *)(&DAT_001725e0 + lVar6) & uVar8;
    uVar13 = uVar13 ^ *(uint *)(&DAT_001725f0 + lVar6) & uVar9;
    uVar14 = uVar14 ^ *(uint *)(&DAT_00172600 + lVar6) & uVar10;
    uVar18 = uVar18 ^ *(uint *)((long)&DAT_001725d4 + lVar6) & uVar3;
    uVar19 = uVar19 ^ *(uint *)((long)&DAT_001725e4 + lVar6) & uVar29;
    uVar20 = uVar20 ^ *(uint *)((long)&DAT_001725f4 + lVar6) & uVar30;
    uVar21 = uVar21 ^ *(uint *)((long)&DAT_00172604 + lVar6) & uVar31;
    uVar32 = uVar32 ^ *(uint *)((long)&DAT_001725d8 + lVar6) & uVar2;
    uVar33 = uVar33 ^ *(uint *)((long)&DAT_001725e8 + lVar6) & uVar22;
    uVar34 = uVar34 ^ *(uint *)((long)&DAT_001725f8 + lVar6) & uVar23;
    uVar35 = uVar35 ^ *(uint *)((long)&DAT_00172608 + lVar6) & uVar24;
    uVar25 = uVar25 ^ *(uint *)((long)&DAT_001725dc + lVar6) & uVar7;
    uVar26 = uVar26 ^ *(uint *)((long)&DAT_001725ec + lVar6) & uVar15;
    uVar27 = uVar27 ^ *(uint *)((long)&DAT_001725fc + lVar6) & uVar16;
    uVar28 = uVar28 ^ *(uint *)((long)&DAT_0017260c + lVar6) & uVar17;
    uVar5 = uVar5 + 0x200020;
    uVar8 = uVar8 + 0x200020;
    uVar9 = uVar9 + 0x200020;
    uVar10 = uVar10 + 0x200020;
    uVar7 = uVar7 + 0x200020;
    uVar15 = uVar15 + 0x200020;
    uVar16 = uVar16 + 0x200020;
    uVar17 = uVar17 + 0x200020;
    uVar2 = uVar2 + 0x200020;
    uVar22 = uVar22 + 0x200020;
    uVar23 = uVar23 + 0x200020;
    uVar24 = uVar24 + 0x200020;
    uVar3 = uVar3 + 0x200020;
    uVar29 = uVar29 + 0x200020;
    uVar30 = uVar30 + 0x200020;
    uVar31 = uVar31 + 0x200020;
    lVar6 = lVar6 + 0x40;
  } while (lVar6 != 0x200);
  uVar3 = uVar28 ^ uVar26 ^ uVar27 ^ uVar25;
  uVar5 = uVar35 ^ uVar33 ^ uVar34 ^ uVar32;
  uVar7 = uVar21 ^ uVar19 ^ uVar20 ^ uVar18;
  uVar2 = uVar14 ^ uVar12 ^ uVar13 ^ uVar11;
  uVar1 = ((uVar1 & 0x40004) * 0x3c00 & uVar5 << 4 ^ uVar5) >> 8 & 0xf000f0 |
          ((uVar4 >> 8 & 0x40004) * 0x3c00 & uVar7 << 4 ^ uVar7) >> 4 & 0xf000f00 |
          ((uVar1 >> 8 & 0x40004) * 0x3c00 & uVar3 << 4 ^ uVar3) & 0xf000f000;
  uVar2 = ((uVar4 & 0x40004) * 0x3c00 & uVar2 << 4 ^ uVar2) >> 0xc & 0xf000f | uVar1;
  uVar1 = (uVar1 >> 4 ^ uVar2) & 0x7030702;
  uVar1 = uVar1 << 4 ^ uVar2 ^ uVar1;
  uVar2 = (uVar1 >> 8 ^ uVar1) & 0x4e009e;
  uVar2 = uVar2 << 8 ^ uVar1 ^ uVar2;
  uVar1 = (uVar2 >> 0x10 ^ uVar2) & 0xd9d3;
  uVar2 = uVar1 << 0x10 ^ uVar2;
  uVar1 = uVar1 ^ uVar2;
  uVar2 = (uVar1 >> 4 ^ uVar2) & 0x5040004;
  uVar2 = uVar2 << 4 ^ uVar1 ^ uVar2;
  uVar1 = (uVar1 >> 1 ^ uVar2) & 0x4045015;
  return (LR)((ulong)(uVar1 * 2 ^ uVar2 ^ in.L ^ uVar1) << 0x20 | (ulong)in >> 0x20);
}

Assistant:

static inline LR des_round(LR in, const des_keysched *sched, size_t round)
{
    LR out;
    out.L = in.R;
    out.R = in.L ^ des_f(in.R, sched->k7531[round], sched->k6420[round]);
    return out;
}